

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnIfExceptExpr
          (BinaryReaderIR *this,Type sig_type,Index except_index)

{
  Expr *pEVar1;
  Result RVar2;
  pointer __p;
  Location local_a0;
  Var local_80;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  Expr *local_30;
  
  MakeUnique<wabt::IfExceptExpr>();
  GetLocation(&local_a0,this);
  Var::Var(&local_80,except_index,&local_a0);
  Var::operator=((Var *)&local_30[5].super_intrusive_list_base<wabt::Expr>.prev_,&local_80);
  Var::~Var(&local_80);
  SetBlockDeclaration(this,(BlockDeclaration *)&local_30[1].loc.filename.size_,sig_type);
  pEVar1 = local_30;
  local_30 = (Expr *)0x0;
  local_38._M_head_impl = pEVar1;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
  if (local_38._M_head_impl != (Expr *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Expr[1])();
  }
  if (RVar2.enum_ != Error) {
    PushLabel(this,IfExcept,(ExprList *)&pEVar1[3].loc.filename.size_,(Expr *)0x0);
  }
  if (local_30 != (Expr *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::OnIfExceptExpr(Type sig_type, Index except_index) {
  auto expr = MakeUnique<IfExceptExpr>();
  expr->except_var = Var(except_index, GetLocation());
  SetBlockDeclaration(&expr->true_.decl, sig_type);
  ExprList* expr_list = &expr->true_.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::IfExcept, expr_list);
  return Result::Ok;
}